

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::ComputeSigPointSchnorrPubkey
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::ComputeSigPointRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::PubkeyDataStruct(cfd::js::api::ComputeSigPointRequestStruct_const&)>::
  function<cfd::js::api::PubkeyDataStruct(&)(cfd::js::api::ComputeSigPointRequestStruct_const&),void>
            ((function<cfd::js::api::PubkeyDataStruct(cfd::js::api::ComputeSigPointRequestStruct_const&)>
              *)&local_38,SchnorrApi::ComputeSigPointSchnorrPubkey);
  ExecuteJsonApi<cfd::js::api::json::ComputeSigPointRequest,cfd::js::api::json::PubkeyData,cfd::js::api::ComputeSigPointRequestStruct,cfd::js::api::PubkeyDataStruct>
            ((json *)this,request_message,&local_38);
  std::function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::ComputeSigPointRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::ComputeSigPointSchnorrPubkey(
    const std::string &request_message) {
  return ExecuteJsonApi<
      ComputeSigPointRequest, PubkeyData, ComputeSigPointRequestStruct,
      PubkeyDataStruct>(
      request_message, SchnorrApi::ComputeSigPointSchnorrPubkey);
}